

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int libssh2_sftp_stat_ex
              (LIBSSH2_SFTP *sftp,char *path,uint path_len,int stat_type,
              LIBSSH2_SFTP_ATTRIBUTES *attrs)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  bool bVar2;
  uint32_t uVar3;
  ssize_t sVar4;
  ulong uVar5;
  undefined4 uVar6;
  char *errmsg;
  int iVar7;
  uint uVar8;
  uchar *s;
  size_t data_len;
  size_t in_stack_ffffffffffffff88;
  char *local_70;
  uchar *local_68;
  int local_5c;
  uchar *local_58;
  undefined4 local_50;
  int local_4c;
  ulong local_48;
  char *local_40;
  time_t local_38;
  ulong buflen;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    iVar7 = -0x27;
  }
  else {
    local_40 = path;
    local_38 = time((time_t *)0x0);
    local_48 = (ulong)path_len;
    local_4c = path_len + 0xd;
    uVar6 = 0x11;
    if (stat_type == 1) {
      uVar6 = 7;
    }
    local_5c = stat_type;
    local_50 = 9;
    if (stat_type != 2) {
      local_50 = uVar6;
    }
    do {
      channel = sftp->channel;
      pLVar1 = channel->session;
      local_58 = (uchar *)0x0;
      iVar7 = 0;
      if (stat_type == 2) {
        uVar8 = (uint)attrs->flags;
        iVar7 = (uVar8 & 0xc) + (uVar8 & 1) * 8 + (uVar8 & 2) * 4 + 4;
      }
      uVar8 = iVar7 + local_4c;
      buflen = (ulong)uVar8;
      local_70 = (char *)0x0;
      if (sftp->stat_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        local_68 = (uchar *)(*pLVar1->alloc)(buflen,&pLVar1->abstract);
        sftp->stat_packet = local_68;
        if (local_68 != (uchar *)0x0) {
          _libssh2_store_u32(&local_68,uVar8 - 4);
          *local_68 = (uchar)local_50;
          uVar3 = sftp->request_id;
          sftp->request_id = uVar3 + 1;
          sftp->stat_request_id = uVar3;
          local_68 = local_68 + 1;
          _libssh2_store_u32(&local_68,uVar3);
          stat_type = local_5c;
          _libssh2_store_str(&local_68,local_40,local_48);
          if (stat_type == 2) {
            sVar4 = sftp_attr2bin(local_68,attrs);
            local_68 = local_68 + sVar4;
          }
          sftp->stat_state = libssh2_NB_state_created;
          goto LAB_001289d2;
        }
        iVar7 = -6;
        errmsg = "Unable to allocate memory for FXP_*STAT packet";
        local_68 = (uchar *)0x0;
        goto LAB_00128b4c;
      }
LAB_001289d2:
      if (sftp->stat_state == libssh2_NB_state_created) {
        bVar2 = false;
        uVar5 = _libssh2_channel_write(channel,0,sftp->stat_packet,buflen);
        if (uVar5 == 0xffffffffffffffdb) {
          iVar7 = -0x25;
        }
        else {
          iVar7 = (*pLVar1->free)(sftp->stat_packet,&pLVar1->abstract);
          sftp->stat_packet = (uchar *)0x0;
          if (uVar5 == buflen) {
            sftp->stat_state = libssh2_NB_state_sent;
            bVar2 = true;
          }
          else {
            sftp->stat_state = libssh2_NB_state_idle;
            iVar7 = _libssh2_error(pLVar1,-7,"Unable to send STAT/LSTAT/SETSTAT command");
            bVar2 = false;
          }
        }
        stat_type = local_5c;
        if (bVar2) goto LAB_00128a84;
      }
      else {
LAB_00128a84:
        iVar7 = sftp_packet_requirev
                          (sftp,0x1346b5,(uchar *)(ulong)sftp->stat_request_id,(uint32_t)&local_70,
                           &local_58,(size_t *)0x9,in_stack_ffffffffffffff88);
        if (iVar7 == 0) {
          sftp->stat_state = libssh2_NB_state_idle;
          if (*local_70 == 'e') {
            uVar3 = _libssh2_ntohu32((uchar *)(local_70 + 5));
            (*pLVar1->free)(local_70,&pLVar1->abstract);
            if (uVar3 == 0) {
              attrs->permissions = 0;
              attrs->atime = 0;
              attrs->uid = 0;
              attrs->gid = 0;
              attrs->flags = 0;
              attrs->filesize = 0;
              attrs->mtime = 0;
              iVar7 = 0;
            }
            else {
              sftp->last_errno = uVar3;
              iVar7 = -0x1f;
              errmsg = "SFTP Protocol Error";
LAB_00128b4c:
              iVar7 = _libssh2_error(pLVar1,iVar7,errmsg);
            }
          }
          else {
            attrs->permissions = 0;
            attrs->atime = 0;
            attrs->uid = 0;
            attrs->gid = 0;
            attrs->flags = 0;
            attrs->filesize = 0;
            attrs->mtime = 0;
            sVar4 = sftp_bin2attr(attrs,(uchar *)(local_70 + 5),(size_t)(local_58 + -5));
            (*pLVar1->free)(local_70,&pLVar1->abstract);
            iVar7 = 0;
            if (sVar4 < 0) {
              iVar7 = -0x1f;
              errmsg = "Attributes too short in SFTP fstat";
              goto LAB_00128b4c;
            }
          }
        }
        else if (iVar7 != -0x25) {
          if (iVar7 == -0x26) {
            if (local_58 != (uchar *)0x0) {
              (*pLVar1->free)(local_70,&pLVar1->abstract);
            }
            iVar7 = -0x1f;
            errmsg = "SFTP stat packet too short";
          }
          else {
            sftp->stat_state = libssh2_NB_state_idle;
            errmsg = "Timeout waiting for status message";
          }
          goto LAB_00128b4c;
        }
      }
      if (iVar7 != -0x25) {
        return iVar7;
      }
      pLVar1 = sftp->channel->session;
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar7 = _libssh2_wait_socket(pLVar1,local_38);
    } while (iVar7 == 0);
  }
  return iVar7;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_stat_ex(LIBSSH2_SFTP *sftp, const char *path,
                     unsigned int path_len, int stat_type,
                     LIBSSH2_SFTP_ATTRIBUTES *attrs)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_stat(sftp, path, path_len, stat_type, attrs));
    return rc;
}